

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_neg_not(ASMState *as,IRIns *ir,x86Group3 xg)

{
  Reg dest;
  MCode *pMVar1;
  uint uVar2;
  uint uVar3;
  
  dest = ra_dest(as,ir,0xffef);
  uVar2._0_2_ = *(IROpT *)((long)ir + 4);
  uVar2._2_2_ = *(IRRef1 *)((long)ir + 6);
  uVar2 = (-(uint)((0x604208U >> (uVar2 & 0x1f) & 1) != 0) & 0x80200) + xg;
  pMVar1 = as->mcp;
  pMVar1[-1] = ((byte)dest & 7) + (char)xg * '\b' | 0xc0;
  pMVar1[-2] = 0xf7;
  uVar3 = dest >> 3 & 1 | uVar2 >> 1 & 0x104;
  if (uVar3 == 0) {
    pMVar1 = pMVar1 + -2;
  }
  else {
    pMVar1[-3] = (byte)uVar3 | (byte)(uVar2 >> 0x10) | 0x40;
    pMVar1 = pMVar1 + -3;
  }
  as->mcp = pMVar1;
  ra_left(as,dest,(uint)(ir->field_0).op1);
  return;
}

Assistant:

static void asm_neg_not(ASMState *as, IRIns *ir, x86Group3 xg)
{
  Reg dest = ra_dest(as, ir, RSET_GPR);
  emit_rr(as, XO_GROUP3, REX_64IR(ir, xg), dest);
  ra_left(as, dest, ir->op1);
}